

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O3

void ucnv_SBCSFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,UConverterToUnicodeArgs *pToUArgs,
                      UErrorCode *pErrorCode)

{
  byte bVar1;
  byte bVar2;
  UErrorCode *pUVar3;
  UConverter *pUVar4;
  uint uVar5;
  UChar32 UVar6;
  ushort uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  byte *pbVar11;
  byte *pbVar12;
  char *pcVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  byte bVar18;
  byte bVar19;
  int iVar20;
  uint32_t uVar21;
  byte *pbVar22;
  ushort uVar23;
  bool bVar24;
  uint8_t *target;
  uint32_t local_7c;
  UConverter *local_78;
  UConverterFromUnicodeArgs *local_70;
  UErrorCode *local_68;
  UConverterToUnicodeArgs *local_60;
  long local_58;
  UConverterSharedData *local_50;
  UConverter *local_48;
  uint16_t *local_40;
  UChar *noSource;
  
  local_78 = pToUArgs->converter;
  pbVar22 = (byte *)pToUArgs->source;
  local_48 = pFromUArgs->converter;
  target = (uint8_t *)pFromUArgs->target;
  pbVar12 = (byte *)pToUArgs->sourceLimit;
  uVar16 = (ulong)(byte)local_78->toULength;
  if (local_78->toULength < '\x01') {
    bVar18 = 0;
    uVar10 = 0;
    uVar16 = 0;
  }
  else {
    bVar18 = (byte)local_78->mode;
    uVar10 = local_78->toUnicodeStatus;
  }
  local_50 = local_48->sharedData;
  iVar20 = ((int)uVar16 - (int)(char)bVar18) + ((int)pbVar12 - (int)pbVar22);
  if ((0 < iVar20) && (bVar1 = pbVar12[-1], (char)bVar1 < '\0')) {
    if ((iVar20 == 1) || (0xbf < bVar1)) {
      if ((byte)(bVar1 + 0x3e) < 0x2e) {
        pbVar12 = pbVar12 + -1;
      }
    }
    else if (((pbVar12[-2] & 0xf0) == 0xe0) &&
            (((byte)" 000000000000\x1000"[pbVar12[-2] & 0xf] >> (bVar1 >> 5) & 1) != 0)) {
      pbVar12 = pbVar12 + -2;
    }
  }
  uVar5 = *(int *)&pFromUArgs->targetLimit - (int)target;
  local_40 = (local_50->mbcs).fromUnicodeTable;
  local_58 = *(long *)((local_50->mbcs).sbcsIndex +
                      (ulong)(((byte)local_48->options & 0x10) >> 4) * 4 + 0x40);
  uVar21 = (local_50->mbcs).asciiRoundtrips;
  uVar23 = (local_48->useFallback == '\0' | 2) << 10;
  bVar1 = (local_50->mbcs).unicodeMask;
  local_7c = uVar21;
  local_70 = pFromUArgs;
  local_68 = pErrorCode;
  local_60 = pToUArgs;
  if (uVar10 == 0) goto LAB_002c589e;
  if ((int)uVar5 < 1) goto LAB_002c589e;
  local_78->toUnicodeStatus = 0;
  local_78->toULength = '\0';
  uVar15 = uVar16;
  lVar17 = local_58;
LAB_002c59f2:
  local_58._0_1_ = (char)uVar16;
  pbVar11 = pbVar22;
  uVar16 = uVar15;
  if ((char)uVar15 < (char)bVar18) {
    do {
      bVar19 = (byte)uVar16;
      if (local_60->sourceLimit <= pbVar11) {
        uVar8 = (ulong)(char)local_58;
        if ((char)local_58 < (char)bVar19) {
          do {
            local_78->toUBytes[uVar8] = pbVar22[uVar8 - uVar15];
            uVar8 = uVar8 + 1;
          } while (uVar8 < uVar16);
          pbVar22 = pbVar22 + (uVar8 - uVar15);
        }
        else {
          pbVar22 = pbVar11 + (uVar8 - uVar16);
        }
        local_78->toUnicodeStatus = uVar10;
        local_78->toULength = bVar19;
        local_78->mode = (int)(char)bVar18;
        goto LAB_002c5cf4;
      }
      bVar2 = *pbVar11;
      if ((bVar18 < 3) || (1 < bVar19)) {
        bVar19 = (char)bVar2 < -0x40;
      }
      else {
        if (bVar18 == 3) {
          bVar19 = '\x01' << (bVar2 >> 5);
          uVar8 = (ulong)(uVar10 & 0xf);
          pcVar13 = " 000000000000\x1000";
        }
        else {
          bVar19 = (byte)(1 << ((byte)uVar10 & 7));
          uVar8 = (ulong)(bVar2 >> 4);
          pcVar13 = "";
        }
        bVar19 = bVar19 & pcVar13[uVar8];
      }
      if (bVar19 == 0) goto LAB_002c5a91;
      pbVar11 = pbVar11 + 1;
      uVar10 = uVar10 * 0x40 + (uint)bVar2;
      uVar16 = uVar16 + 1;
    } while ((char)uVar16 < (char)bVar18);
  }
  else {
LAB_002c5a91:
    bVar19 = (byte)uVar16;
    if (bVar19 != bVar18) {
      lVar9 = (long)(char)bVar19;
      lVar17 = (long)(char)local_58;
      if ((char)local_58 < (char)bVar19) {
        do {
          local_78->toUBytes[lVar17] = pbVar11[lVar17 - lVar9];
          lVar17 = lVar17 + 1;
        } while (lVar17 < lVar9);
        lVar17 = lVar17 - lVar9;
      }
      else {
        lVar17 = lVar17 - lVar9;
      }
      local_78->toULength = bVar19;
      local_60->source = (char *)(pbVar11 + lVar17);
      local_70->target = (char *)target;
      *local_68 = U_ILLEGAL_CHAR_FOUND;
      return;
    }
  }
  uVar10 = uVar10 - utf8_offsets[(char)bVar18];
  local_58 = lVar17;
  uVar21 = local_7c;
  if (((char)bVar18 < '\x04') || (uVar7 = 0, (bVar1 & 1) != 0)) {
    uVar7 = *(ushort *)
             (lVar17 + (ulong)((uVar10 & 0xf) +
                              (uint)local_40[(uVar10 >> 4 & 0x3f) +
                                             (uint)local_40[(int)uVar10 >> 10]]) * 2);
  }
LAB_002c5aeb:
  pUVar4 = local_48;
  pUVar3 = local_68;
  pbVar22 = pbVar11;
  if (uVar7 < uVar23) {
    noSource = L"";
    UVar6 = _extFromU(local_48,(UConverterSharedData *)(local_48->sharedData->mbcs).extIndexes,
                      uVar10,&noSource,L"",&target,target + uVar5,(int32_t **)0x0,-1,local_70->flush
                      ,local_68);
    if (U_ZERO_ERROR < *pUVar3) {
      pUVar4->fromUChar32 = UVar6;
LAB_002c5c50:
      if (((*local_68 < U_ILLEGAL_ARGUMENT_ERROR) && (local_48->preFromUFirstCP < 0)) &&
         (pbVar12 = (byte *)local_60->sourceLimit, pbVar22 < pbVar12)) {
        bVar18 = *pbVar22;
        uVar10 = (uint)bVar18;
        local_78->toUBytes[0] = bVar18;
        iVar20 = 1;
        if (((char)bVar18 < '\0') && (iVar20 = 0, (byte)(bVar18 + 0x3e) < 0x33)) {
          iVar20 = ((uint)(0xdf < bVar18) - (uint)(bVar18 < 0xf0)) + 3;
        }
        pbVar11 = pbVar22 + 1;
        lVar17 = 1;
        if (pbVar11 < pbVar12) {
          lVar17 = 1;
          do {
            bVar18 = pbVar22[lVar17];
            local_78->toUBytes[(char)lVar17] = bVar18;
            uVar10 = uVar10 * 0x40 + (uint)bVar18;
            lVar17 = lVar17 + 1;
          } while ((long)pbVar12 - (long)pbVar22 != lVar17);
          pbVar11 = pbVar22 + lVar17;
        }
        local_78->toUnicodeStatus = uVar10;
        local_78->toULength = (int8_t)lVar17;
        local_78->mode = iVar20;
        pbVar22 = pbVar11;
      }
LAB_002c5cf4:
      local_60->source = (char *)pbVar22;
      local_70->target = (char *)target;
      return;
    }
    if (-1 < pUVar4->preFromUFirstCP) {
      *local_68 = U_USING_DEFAULT_WARNING;
      goto LAB_002c5c50;
    }
    uVar5 = *(int *)&local_70->targetLimit - (int)target;
    uVar21 = local_7c;
  }
  else {
    *target = (uint8_t)uVar7;
    uVar5 = uVar5 - 1;
    target = target + 1;
  }
LAB_002c589e:
  if (pbVar22 < pbVar12) {
    do {
      if ((int)uVar5 < 1) {
        *local_68 = U_BUFFER_OVERFLOW_ERROR;
        goto LAB_002c5cf4;
      }
      pbVar11 = pbVar22 + 1;
      bVar19 = *pbVar22;
      uVar10 = (uint)bVar19;
      if ((char)bVar19 < '\0') {
        if (bVar19 < 0xe0) {
          if (bVar19 < 0xc2) {
            bVar18 = 0;
          }
          else {
            uVar14 = *pbVar11 ^ 0x80;
            if ((byte)uVar14 < 0x40) {
              uVar10 = uVar10 & 0x1f;
              pbVar11 = pbVar22 + 2;
              uVar7 = *(ushort *)
                       (local_58 + (ulong)((local_50->mbcs).sbcsIndex[uVar10] + uVar14) * 2);
              if (uVar23 <= uVar7) goto LAB_002c596f;
LAB_002c5bfd:
              uVar10 = uVar10 << 6 | uVar14;
              goto LAB_002c5aeb;
            }
LAB_002c59b9:
            bVar24 = 0xdf < bVar19;
            bVar18 = 2;
LAB_002c59c2:
            bVar18 = bVar24 + bVar18;
          }
        }
        else {
          if (bVar19 == 0xe0) {
            uVar16 = (ulong)*pbVar11 ^ 0x80;
            if ((((byte)uVar16 & 0xe0) != 0x20) || (uVar14 = pbVar22[2] ^ 0x80, 0x3f < (byte)uVar14)
               ) goto LAB_002c59b9;
            pbVar11 = pbVar22 + 3;
            uVar7 = *(ushort *)(local_58 + (ulong)((local_50->mbcs).sbcsIndex[uVar16] + uVar14) * 2)
            ;
            if (uVar7 < uVar23) {
              uVar10 = (uint)uVar16;
              goto LAB_002c5bfd;
            }
LAB_002c596f:
            *target = (uint8_t)uVar7;
            pbVar22 = pbVar11;
            goto LAB_002c5982;
          }
          bVar18 = 0;
          if ((byte)(bVar19 + 0x3e) < 0x33) {
            bVar18 = 0xef < bVar19 | 2;
            bVar24 = true;
            goto LAB_002c59c2;
          }
        }
        uVar15 = 1;
        uVar16 = 0;
        lVar17 = local_58;
        pbVar22 = pbVar11;
        goto LAB_002c59f2;
      }
      if ((uVar21 >> (bVar19 >> 2 & 0x1f) & 1) == 0) goto LAB_002c59a5;
      *target = bVar19;
      pbVar22 = pbVar11;
LAB_002c5982:
      target = target + 1;
      uVar5 = uVar5 - 1;
      if (pbVar12 <= pbVar22) break;
    } while( true );
  }
  goto LAB_002c5c50;
LAB_002c59a5:
  uVar7 = *(ushort *)(local_58 + (ulong)((local_50->mbcs).sbcsIndex[0] + uVar10) * 2);
  goto LAB_002c5aeb;
}

Assistant:

static void U_CALLCONV
ucnv_SBCSFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,
                  UConverterToUnicodeArgs *pToUArgs,
                  UErrorCode *pErrorCode) {
    UConverter *utf8, *cnv;
    const uint8_t *source, *sourceLimit;
    uint8_t *target;
    int32_t targetCapacity;

    const uint16_t *table, *sbcsIndex;
    const uint16_t *results;

    int8_t oldToULength, toULength, toULimit;

    UChar32 c;
    uint8_t b, t1, t2;

    uint32_t asciiRoundtrips;
    uint16_t value, minValue = 0;
    UBool hasSupplementary;

    /* set up the local pointers */
    utf8=pToUArgs->converter;
    cnv=pFromUArgs->converter;
    source=(uint8_t *)pToUArgs->source;
    sourceLimit=(uint8_t *)pToUArgs->sourceLimit;
    target=(uint8_t *)pFromUArgs->target;
    targetCapacity=(int32_t)(pFromUArgs->targetLimit-pFromUArgs->target);

    table=cnv->sharedData->mbcs.fromUnicodeTable;
    sbcsIndex=cnv->sharedData->mbcs.sbcsIndex;
    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        results=(uint16_t *)cnv->sharedData->mbcs.swapLFNLFromUnicodeBytes;
    } else {
        results=(uint16_t *)cnv->sharedData->mbcs.fromUnicodeBytes;
    }
    asciiRoundtrips=cnv->sharedData->mbcs.asciiRoundtrips;

    if(cnv->useFallback) {
        /* use all roundtrip and fallback results */
        minValue=0x800;
    } else {
        /* use only roundtrips and fallbacks from private-use characters */
        minValue=0xc00;
    }
    hasSupplementary=(UBool)(cnv->sharedData->mbcs.unicodeMask&UCNV_HAS_SUPPLEMENTARY);

    /* get the converter state from the UTF-8 UConverter */
    if(utf8->toULength > 0) {
        toULength=oldToULength=utf8->toULength;
        toULimit=(int8_t)utf8->mode;
        c=(UChar32)utf8->toUnicodeStatus;
    } else {
        toULength=oldToULength=toULimit=0;
        c = 0;
    }

    // The conversion loop checks source<sourceLimit only once per 1/2/3-byte character.
    // If the buffer ends with a truncated 2- or 3-byte sequence,
    // then we reduce the sourceLimit to before that,
    // and collect the remaining bytes after the conversion loop.
    {
        // Do not go back into the bytes that will be read for finishing a partial
        // sequence from the previous buffer.
        int32_t length=(int32_t)(sourceLimit-source) - (toULimit-oldToULength);
        if(length>0) {
            uint8_t b1=*(sourceLimit-1);
            if(U8_IS_SINGLE(b1)) {
                // common ASCII character
            } else if(U8_IS_TRAIL(b1) && length>=2) {
                uint8_t b2=*(sourceLimit-2);
                if(0xe0<=b2 && b2<0xf0 && U8_IS_VALID_LEAD3_AND_T1(b2, b1)) {
                    // truncated 3-byte sequence
                    sourceLimit-=2;
                }
            } else if(0xc2<=b1 && b1<0xf0) {
                // truncated 2- or 3-byte sequence
                --sourceLimit;
            }
        }
    }

    if(c!=0 && targetCapacity>0) {
        utf8->toUnicodeStatus=0;
        utf8->toULength=0;
        goto moreBytes;
        /*
         * Note: We could avoid the goto by duplicating some of the moreBytes
         * code, but only up to the point of collecting a complete UTF-8
         * sequence; then recurse for the toUBytes[toULength]
         * and then continue with normal conversion.
         *
         * If so, move this code to just after initializing the minimum
         * set of local variables for reading the UTF-8 input
         * (utf8, source, target, limits but not cnv, table, minValue, etc.).
         *
         * Potential advantages:
         * - avoid the goto
         * - oldToULength could become a local variable in just those code blocks
         *   that deal with buffer boundaries
         * - possibly faster if the goto prevents some compiler optimizations
         *   (this would need measuring to confirm)
         * Disadvantage:
         * - code duplication
         */
    }

    /* conversion loop */
    while(source<sourceLimit) {
        if(targetCapacity>0) {
            b=*source++;
            if(U8_IS_SINGLE(b)) {
                /* convert ASCII */
                if(IS_ASCII_ROUNDTRIP(b, asciiRoundtrips)) {
                    *target++=(uint8_t)b;
                    --targetCapacity;
                    continue;
                } else {
                    c=b;
                    value=SBCS_RESULT_FROM_UTF8(sbcsIndex, results, 0, c);
                }
            } else {
                if(b<0xe0) {
                    if( /* handle U+0080..U+07FF inline */
                        b>=0xc2 &&
                        (t1=(uint8_t)(*source-0x80)) <= 0x3f
                    ) {
                        c=b&0x1f;
                        ++source;
                        value=SBCS_RESULT_FROM_UTF8(sbcsIndex, results, c, t1);
                        if(value>=minValue) {
                            *target++=(uint8_t)value;
                            --targetCapacity;
                            continue;
                        } else {
                            c=(c<<6)|t1;
                        }
                    } else {
                        c=-1;
                    }
                } else if(b==0xe0) {
                    if( /* handle U+0800..U+0FFF inline */
                        (t1=(uint8_t)(source[0]-0x80)) <= 0x3f && t1 >= 0x20 &&
                        (t2=(uint8_t)(source[1]-0x80)) <= 0x3f
                    ) {
                        c=t1;
                        source+=2;
                        value=SBCS_RESULT_FROM_UTF8(sbcsIndex, results, c, t2);
                        if(value>=minValue) {
                            *target++=(uint8_t)value;
                            --targetCapacity;
                            continue;
                        } else {
                            c=(c<<6)|t2;
                        }
                    } else {
                        c=-1;
                    }
                } else {
                    c=-1;
                }

                if(c<0) {
                    /* handle "complicated" and error cases, and continuing partial characters */
                    oldToULength=0;
                    toULength=1;
                    toULimit=U8_COUNT_BYTES_NON_ASCII(b);
                    c=b;
moreBytes:
                    while(toULength<toULimit) {
                        /*
                         * The sourceLimit may have been adjusted before the conversion loop
                         * to stop before a truncated sequence.
                         * Here we need to use the real limit in case we have two truncated
                         * sequences at the end.
                         * See ticket #7492.
                         */
                        if(source<(uint8_t *)pToUArgs->sourceLimit) {
                            b=*source;
                            if(icu::UTF8::isValidTrail(c, b, toULength, toULimit)) {
                                ++source;
                                ++toULength;
                                c=(c<<6)+b;
                            } else {
                                break; /* sequence too short, stop with toULength<toULimit */
                            }
                        } else {
                            /* store the partial UTF-8 character, compatible with the regular UTF-8 converter */
                            source-=(toULength-oldToULength);
                            while(oldToULength<toULength) {
                                utf8->toUBytes[oldToULength++]=*source++;
                            }
                            utf8->toUnicodeStatus=c;
                            utf8->toULength=toULength;
                            utf8->mode=toULimit;
                            pToUArgs->source=(char *)source;
                            pFromUArgs->target=(char *)target;
                            return;
                        }
                    }

                    if(toULength==toULimit) {
                        c-=utf8_offsets[toULength];
                        if(toULength<=3) {  /* BMP */
                            value=MBCS_SINGLE_RESULT_FROM_U(table, results, c);
                        } else {
                            /* supplementary code point */
                            if(!hasSupplementary) {
                                /* BMP-only codepages are stored without stage 1 entries for supplementary code points */
                                value=0;
                            } else {
                                value=MBCS_SINGLE_RESULT_FROM_U(table, results, c);
                            }
                        }
                    } else {
                        /* error handling: illegal UTF-8 byte sequence */
                        source-=(toULength-oldToULength);
                        while(oldToULength<toULength) {
                            utf8->toUBytes[oldToULength++]=*source++;
                        }
                        utf8->toULength=toULength;
                        pToUArgs->source=(char *)source;
                        pFromUArgs->target=(char *)target;
                        *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                        return;
                    }
                }
            }

            if(value>=minValue) {
                /* output the mapping for c */
                *target++=(uint8_t)value;
                --targetCapacity;
            } else {
                /* value<minValue means c is unassigned (unmappable) */
                /*
                 * Try an extension mapping.
                 * Pass in no source because we don't have UTF-16 input.
                 * If we have a partial match on c, we will return and revert
                 * to UTF-8->UTF-16->charset conversion.
                 */
                static const UChar nul=0;
                const UChar *noSource=&nul;
                c=_extFromU(cnv, cnv->sharedData,
                            c, &noSource, noSource,
                            &target, target+targetCapacity,
                            NULL, -1,
                            pFromUArgs->flush,
                            pErrorCode);

                if(U_FAILURE(*pErrorCode)) {
                    /* not mappable or buffer overflow */
                    cnv->fromUChar32=c;
                    break;
                } else if(cnv->preFromUFirstCP>=0) {
                    /*
                     * Partial match, return and revert to pivoting.
                     * In normal from-UTF-16 conversion, we would just continue
                     * but then exit the loop because the extension match would
                     * have consumed the source.
                     */
                    *pErrorCode=U_USING_DEFAULT_WARNING;
                    break;
                } else {
                    /* a mapping was written to the target, continue */

                    /* recalculate the targetCapacity after an extension mapping */
                    targetCapacity=(int32_t)(pFromUArgs->targetLimit-(char *)target);
                }
            }
        } else {
            /* target is full */
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    /*
     * The sourceLimit may have been adjusted before the conversion loop
     * to stop before a truncated sequence.
     * If so, then collect the truncated sequence now.
     */
    if(U_SUCCESS(*pErrorCode) &&
            cnv->preFromUFirstCP<0 &&
            source<(sourceLimit=(uint8_t *)pToUArgs->sourceLimit)) {
        c=utf8->toUBytes[0]=b=*source++;
        toULength=1;
        toULimit=U8_COUNT_BYTES(b);
        while(source<sourceLimit) {
            utf8->toUBytes[toULength++]=b=*source++;
            c=(c<<6)+b;
        }
        utf8->toUnicodeStatus=c;
        utf8->toULength=toULength;
        utf8->mode=toULimit;
    }

    /* write back the updated pointers */
    pToUArgs->source=(char *)source;
    pFromUArgs->target=(char *)target;
}